

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall
Clasp::ClaspConfig::addConfigurator(ClaspConfig *this,Configurator *c,Type t,bool once)

{
  undefined3 in_register_00000009;
  ConfiguratorProxy local_10;
  
  local_10.set = 0;
  local_10.cfg = (uint64)c;
  if (CONCAT31(in_register_00000009,once) != 0) {
    local_10.cfg = (ulong)c | 0x4000000000000000;
  }
  if (t == Acquire) {
    local_10.cfg = local_10.cfg | 0x2000000000000000;
  }
  bk_lib::
  pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
  ::push_back(&this->impl_->pp,&local_10);
  return;
}

Assistant:

void ClaspConfig::addConfigurator(Configurator* c, Ownership_t::Type t, bool once) {
	impl_->add(c, t, once);
}